

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O0

mdns_record_srv_t *
mdns_record_parse_srv
          (mdns_record_srv_t *__return_storage_ptr__,void *buffer,size_t size,size_t offset,
          size_t length,char *strbuffer,size_t capacity)

{
  uint16_t uVar1;
  uint16_t *puVar2;
  mdns_string_t mVar3;
  char *local_48;
  size_t local_40;
  uint16_t *recorddata;
  char *strbuffer_local;
  size_t length_local;
  size_t offset_local;
  size_t size_local;
  void *buffer_local;
  
  length_local = offset;
  offset_local = size;
  size_local = (size_t)buffer;
  memset(__return_storage_ptr__,0,0x18);
  if ((length_local + length <= offset_local) && (7 < length)) {
    puVar2 = (uint16_t *)(size_local + length_local);
    uVar1 = ntohs(*puVar2);
    __return_storage_ptr__->priority = uVar1;
    uVar1 = ntohs(puVar2[1]);
    __return_storage_ptr__->weight = uVar1;
    uVar1 = ntohs(puVar2[2]);
    __return_storage_ptr__->port = uVar1;
    length_local = length_local + 6;
    mVar3 = mdns_string_extract((void *)size_local,offset_local,&length_local,strbuffer,capacity);
    local_48 = mVar3.str;
    (__return_storage_ptr__->name).str = local_48;
    local_40 = mVar3.length;
    (__return_storage_ptr__->name).length = local_40;
  }
  return __return_storage_ptr__;
}

Assistant:

mdns_record_srv_t
mdns_record_parse_srv(const void* buffer, size_t size, size_t offset, size_t length,
                      char* strbuffer, size_t capacity) {
	mdns_record_srv_t srv;
	memset(&srv, 0, sizeof(mdns_record_srv_t));
	// Read the priority, weight, port number and the discovery name
	// SRV record format (http://www.ietf.org/rfc/rfc2782.txt):
	// 2 bytes network-order unsigned priority
	// 2 bytes network-order unsigned weight
	// 2 bytes network-order unsigned port
	// string: discovery (domain) name, minimum 2 bytes when compressed
	if ((size >= offset + length) && (length >= 8)) {
		const uint16_t* recorddata = (const uint16_t*)((const char*)buffer + offset);
		srv.priority = ntohs(*recorddata++);
		srv.weight = ntohs(*recorddata++);
		srv.port = ntohs(*recorddata++);
		offset += 6;
		srv.name = mdns_string_extract(buffer, size, &offset, strbuffer, capacity);
	}
	return srv;
}